

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Demodulation.hpp
# Opt level: O0

IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_Demodulation_hpp:80:18),_Lib::IterTraits<Lib::MappingIterator<Lib::VirtualIterator<Kernel::Term_*>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_Demodulation_hpp:84:18),_Inferences::ALASCA::Demodulation::Rhs>_>_>_>_>
* Inferences::ALASCA::Demodulation::Rhs::iter(AlascaState *shared,Clause *cl)

{
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>
  i;
  IterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>_>
  *in_RSI;
  Clause *in_RDI;
  undefined1 in_stack_ffffffffffffff60 [16];
  undefined8 in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff90;
  IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_Demodulation_hpp:80:18),_Lib::IterTraits<Lib::MappingIterator<Lib::VirtualIterator<Kernel::Term_*>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_Demodulation_hpp:84:18),_Inferences::ALASCA::Demodulation::Rhs>_>_>_>_>
  *in_stack_ffffffffffffff98;
  anon_class_8_1_3fcf6527_for__func f;
  
  f.cl = in_RDI;
  Kernel::Clause::iterLits(in_RDI);
  i._iter._16_8_ = in_stack_ffffffffffffff70;
  i._iter._func.a = (Clause *)in_stack_ffffffffffffff60._0_8_;
  i._iter._inner._next = in_stack_ffffffffffffff60._8_4_;
  i._iter._inner._from = in_stack_ffffffffffffff60._12_4_;
  Lib::
  iterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,Lib::arrayIter<Kernel::Clause,unsigned_int>(Kernel::Clause&,unsigned_int)::_lambda(auto:1)_1_,Kernel::Literal*&>>>
            (i);
  Lib::
  IterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,Lib::arrayIter<Kernel::Clause,unsigned_int>(Kernel::Clause&,unsigned_int)::{lambda(auto:1)#1},Kernel::Literal*&>>>
  ::
  flatMap<Inferences::ALASCA::Demodulation::Rhs::iter(Kernel::AlascaState&,Kernel::Clause*)::_lambda(Kernel::Literal*)_1_>
            (in_RSI,f);
  Lib::
  IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ALASCA/Demodulation.hpp:80:18),_Lib::IterTraits<Lib::MappingIterator<Lib::VirtualIterator<Kernel::Term_*>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ALASCA/Demodulation.hpp:84:18),_Inferences::ALASCA::Demodulation::Rhs>_>_>_>_>
  ::timeTraced(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  Lib::
  IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ALASCA/Demodulation.hpp:80:18),_Lib::IterTraits<Lib::MappingIterator<Lib::VirtualIterator<Kernel::Term_*>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ALASCA/Demodulation.hpp:84:18),_Inferences::ALASCA::Demodulation::Rhs>_>_>_>_>
  ::~IterTraits((IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_Demodulation_hpp:80:18),_Lib::IterTraits<Lib::MappingIterator<Lib::VirtualIterator<Kernel::Term_*>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_Demodulation_hpp:84:18),_Inferences::ALASCA::Demodulation::Rhs>_>_>_>_>
                 *)0x3daf6f);
  return (IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_Demodulation_hpp:80:18),_Lib::IterTraits<Lib::MappingIterator<Lib::VirtualIterator<Kernel::Term_*>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_Demodulation_hpp:84:18),_Inferences::ALASCA::Demodulation::Rhs>_>_>_>_>
          *)in_RDI;
}

Assistant:

static auto iter(AlascaState& shared, Clause* cl)
    {
      // TIME_TRACE("alasca demodulation rhs")
      return iterTraits(cl->iterLits())
        .flatMap([cl](Literal* lit) {

          return iterTraits(vi(new NonVariableNonTypeIterator(lit)))
            // TODO filter our things that can never be rewritten
            .map([=](auto t) { return Rhs { .term = TypedTermList(t), .ordOptimization = !(lit->isEquality() && lit->isPositive()), .clause = cl, }; })
            ;
        })
      .timeTraced("alasca demodulation rhs");

    }